

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.h
# Opt level: O0

HRESULT __thiscall
CustomMessage<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/WScriptJsrt.cpp:987:39),_WScriptJsrt::CallbackMessage>
::Call(CustomMessage<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_bin_ch_WScriptJsrt_cpp:987:39),_WScriptJsrt::CallbackMessage>
       *this,LPCSTR fileName)

{
  HRESULT HVar1;
  LPCSTR fileName_local;
  CustomMessage<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_bin_ch_WScriptJsrt_cpp:987:39),_WScriptJsrt::CallbackMessage>
  *this_local;
  
  HVar1 = anon_class_1_0_00000001_for_m_func::operator()
                    ((anon_class_1_0_00000001_for_m_func *)&this->field_0x18,
                     &this->super_CallbackMessage);
  return HVar1;
}

Assistant:

virtual HRESULT Call(LPCSTR fileName) override
    {
        return m_func(*this);
    }